

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

int xmlGetThreadId(void)

{
  pthread_t pVar1;
  undefined4 uStack_18;
  int ret;
  pthread_t id;
  
  if (libxml_is_threaded == 0) {
    id._4_4_ = 0;
  }
  else {
    pVar1 = pthread_self();
    uStack_18 = (int)pVar1;
    id._4_4_ = uStack_18;
  }
  return id._4_4_;
}

Assistant:

int
xmlGetThreadId(void)
{
#ifdef HAVE_POSIX_THREADS
    pthread_t id;
    int ret;

    if (libxml_is_threaded == 0)
        return (0);
    id = pthread_self();
    /* horrible but preserves compat, see warning above */
    memcpy(&ret, &id, sizeof(ret));
    return (ret);
#elif defined HAVE_WIN32_THREADS
    return GetCurrentThreadId();
#else
    return ((int) 0);
#endif
}